

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall
cmake::Run(cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool noconfigure)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *psVar4;
  undefined1 local_288 [48];
  string message;
  ifstream fin;
  byte abStack_218 [488];
  
  SetArgs(this,args);
  bVar1 = cmSystemTools::GetErrorOccurredFlag();
  if (bVar1) {
    return -1;
  }
  if (this->CurrentWorkingMode == HELP_MODE) {
    return 0;
  }
  if (this->Trace == true) {
    PrintTraceFormatVersion(this);
  }
  if ((this->CheckStampList)._M_string_length != 0) {
    bVar1 = cmsys::SystemTools::FileExists(&this->CheckStampList);
    if (bVar1) {
      std::ifstream::ifstream(&fin,(this->CheckStampList)._M_dataplus._M_p,_S_in);
      if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
        local_288._0_8_ = local_288 + 0x10;
        local_288._8_8_ = (char *)0x0;
        local_288[0x10] = '\0';
        do {
          bVar1 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&fin,(string *)local_288,(bool *)0x0,0xffffffffffffffff);
          if (!bVar1) {
            std::__cxx11::string::~string((string *)local_288);
            std::ifstream::~ifstream(&fin);
            return 0;
          }
          bVar1 = cmakeCheckStampFile((string *)local_288);
        } while (bVar1);
        std::__cxx11::string::~string((string *)local_288);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "CMake is re-running because generate.stamp.list ");
        std::operator<<(poVar3,"could not be read.\n");
      }
      std::ifstream::~ifstream(&fin);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "CMake is re-running because generate.stamp.list ");
      std::operator<<(poVar3,"is missing.\n");
    }
  }
  if (((this->CheckStampFile)._M_string_length != 0) &&
     (bVar1 = cmakeCheckStampFile(&this->CheckStampFile), bVar1)) {
    return 0;
  }
  if (this->CurrentWorkingMode == NORMAL_MODE) {
    if (this->FreshCache != false) {
      psVar4 = GetHomeOutputDirectory_abi_cxx11_(this);
      DeleteCache(this,psVar4);
    }
    iVar2 = LoadCache(this);
    if (iVar2 < 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fin,"Error executing cmake::LoadCache(). Aborting.\n",
                 (allocator<char> *)local_288);
      cmSystemTools::Error((string *)&fin);
      goto LAB_001e17aa;
    }
  }
  else {
    if (this->FreshCache != false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fin,"--fresh allowed only when configuring a project",
                 (allocator<char> *)local_288);
      cmSystemTools::Error((string *)&fin);
      goto LAB_001e17aa;
    }
    AddCMakePaths(this);
  }
  ProcessPresetVariables(this);
  ProcessPresetEnvironment(this);
  bVar1 = SetCacheArgs(this,args);
  if (bVar1) {
    PrintPresetVariables(this);
    PrintPresetEnvironment(this);
    if (this->CurrentWorkingMode != NORMAL_MODE) {
      bVar1 = cmSystemTools::GetErrorOccurredFlag();
      return -(uint)bVar1;
    }
    bVar1 = cmsys::SystemTools::HasEnv("MAKEFLAGS");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fin,"MAKEFLAGS=",(allocator<char> *)local_288);
      cmsys::SystemTools::PutEnv((string *)&fin);
      std::__cxx11::string::~string((string *)&fin);
    }
    PreLoadCMakeFiles(this);
    if (noconfigure) {
      return 0;
    }
    iVar2 = CheckBuildSystem(this);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = Configure(this);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = Generate(this);
    if (iVar2 == 0) {
      _fin = (pointer)0x22;
      psVar4 = GetHomeOutputDirectory_abi_cxx11_(this);
      local_288._8_8_ = (psVar4->_M_dataplus)._M_p;
      local_288._0_8_ = psVar4->_M_string_length;
      cmStrCat<>(&message,(cmAlphaNum *)&fin,(cmAlphaNum *)local_288);
      UpdateProgress(this,&message,-1.0);
      std::__cxx11::string::~string((string *)&message);
      return 0;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fin,
               "CMake Generate step failed.  Build files cannot be regenerated correctly.",
               (allocator<char> *)local_288);
    cmSystemTools::Message((string *)&fin,(char *)0x0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fin,"Run \'cmake --help\' for all supported options.",
               (allocator<char> *)local_288);
    cmSystemTools::Error((string *)&fin);
  }
LAB_001e17aa:
  std::__cxx11::string::~string((string *)&fin);
  return -1;
}

Assistant:

int cmake::Run(const std::vector<std::string>& args, bool noconfigure)
{
  // Process the arguments
  this->SetArgs(args);
  if (cmSystemTools::GetErrorOccurredFlag()) {
    return -1;
  }
  if (this->GetWorkingMode() == HELP_MODE) {
    return 0;
  }

  // Log the trace format version to the desired output
  if (this->GetTrace()) {
    this->PrintTraceFormatVersion();
  }

  // If we are given a stamp list file check if it is really out of date.
  if (!this->CheckStampList.empty() &&
      cmakeCheckStampList(this->CheckStampList)) {
    return 0;
  }

  // If we are given a stamp file check if it is really out of date.
  if (!this->CheckStampFile.empty() &&
      cmakeCheckStampFile(this->CheckStampFile)) {
    return 0;
  }

  if (this->GetWorkingMode() == NORMAL_MODE) {
    if (this->FreshCache) {
      this->DeleteCache(this->GetHomeOutputDirectory());
    }
    // load the cache
    if (this->LoadCache() < 0) {
      cmSystemTools::Error("Error executing cmake::LoadCache(). Aborting.\n");
      return -1;
    }
  } else {
    if (this->FreshCache) {
      cmSystemTools::Error("--fresh allowed only when configuring a project");
      return -1;
    }
    this->AddCMakePaths();
  }

#ifndef CMAKE_BOOTSTRAP
  this->ProcessPresetVariables();
  this->ProcessPresetEnvironment();
#endif
  // Add any cache args
  if (!this->SetCacheArgs(args)) {
    cmSystemTools::Error("Run 'cmake --help' for all supported options.");
    return -1;
  }
#ifndef CMAKE_BOOTSTRAP
  this->PrintPresetVariables();
  this->PrintPresetEnvironment();
#endif

  // In script mode we terminate after running the script.
  if (this->GetWorkingMode() != NORMAL_MODE) {
    if (cmSystemTools::GetErrorOccurredFlag()) {
      return -1;
    }
    return 0;
  }

  // If MAKEFLAGS are given in the environment, remove the environment
  // variable.  This will prevent try-compile from succeeding when it
  // should fail (if "-i" is an option).  We cannot simply test
  // whether "-i" is given and remove it because some make programs
  // encode the MAKEFLAGS variable in a strange way.
  if (cmSystemTools::HasEnv("MAKEFLAGS")) {
    cmSystemTools::PutEnv("MAKEFLAGS=");
  }

  this->PreLoadCMakeFiles();

  if (noconfigure) {
    return 0;
  }

  // now run the global generate
  // Check the state of the build system to see if we need to regenerate.
  if (!this->CheckBuildSystem()) {
    return 0;
  }

  int ret = this->Configure();
  if (ret) {
#if defined(CMAKE_HAVE_VS_GENERATORS)
    if (!this->VSSolutionFile.empty() && this->GlobalGenerator) {
      // CMake is running to regenerate a Visual Studio build tree
      // during a build from the VS IDE.  The build files cannot be
      // regenerated, so we should stop the build.
      cmSystemTools::Message("CMake Configure step failed.  "
                             "Build files cannot be regenerated correctly.  "
                             "Attempting to stop IDE build.");
      cmGlobalVisualStudioGenerator& gg =
        cm::static_reference_cast<cmGlobalVisualStudioGenerator>(
          this->GlobalGenerator);
      gg.CallVisualStudioMacro(cmGlobalVisualStudioGenerator::MacroStop,
                               this->VSSolutionFile);
    }
#endif
    return ret;
  }
  ret = this->Generate();
  if (ret) {
    cmSystemTools::Message("CMake Generate step failed.  "
                           "Build files cannot be regenerated correctly.");
    return ret;
  }
  std::string message = cmStrCat("Build files have been written to: ",
                                 this->GetHomeOutputDirectory());
  this->UpdateProgress(message, -1);
  return ret;
}